

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_sub_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  int iVar2;
  int local_24;
  int s;
  int ret;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  iVar1 = A->s;
  if (A->s * B->s < 1) {
    local_24 = mbedtls_mpi_add_abs(X,A,B);
    if (local_24 == 0) {
      X->s = iVar1;
    }
  }
  else {
    iVar2 = mbedtls_mpi_cmp_abs(A,B);
    if (iVar2 < 0) {
      local_24 = mbedtls_mpi_sub_abs(X,B,A);
      if (local_24 == 0) {
        X->s = -iVar1;
      }
    }
    else {
      local_24 = mbedtls_mpi_sub_abs(X,A,B);
      if (local_24 == 0) {
        X->s = iVar1;
      }
    }
  }
  return local_24;
}

Assistant:

int mbedtls_mpi_sub_mpi( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret, s;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( A != NULL );
    MPI_VALIDATE_RET( B != NULL );

    s = A->s;
    if( A->s * B->s > 0 )
    {
        if( mbedtls_mpi_cmp_abs( A, B ) >= 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( X, A, B ) );
            X->s =  s;
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( X, B, A ) );
            X->s = -s;
        }
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( X, A, B ) );
        X->s = s;
    }

cleanup:

    return( ret );
}